

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void indexedX0p_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  add_indexed_operand(info,M680X_REG_X,true,'\x01','\0',0,true);
  return;
}

Assistant:

static void indexedX0p_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	add_indexed_operand(info, M680X_REG_X, true, 1, M680X_OFFSET_NONE,
		0, true);
}